

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdconnection.cc
# Opt level: O3

int operator<(bdProxyTuple *a,bdProxyTuple *b)

{
  int iVar1;
  int iVar2;
  
  iVar1 = operator<(&a->srcId,&b->srcId);
  iVar2 = 1;
  if (iVar1 == 0) {
    iVar1 = operator==(&a->srcId,&b->srcId);
    if (iVar1 != 0) {
      iVar1 = operator<(&a->proxyId,&b->proxyId);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = operator==(&a->proxyId,&b->proxyId);
      if ((iVar1 != 0) && (iVar1 = operator<(&a->destId,&b->destId), iVar1 != 0)) {
        return 1;
      }
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int operator<(const bdProxyTuple &a, const bdProxyTuple &b) {
	if (a.srcId < b.srcId)
		return 1;

	if (a.srcId == b.srcId) {
 		if (a.proxyId < b.proxyId)
			return 1;
 		else if (a.proxyId == b.proxyId)
			if (a.destId < b.destId)
				return 1;
	}
	return 0;
}